

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Vector<float,_3> __thiscall tcu::operator*(tcu *this,Matrix<float,_3,_4> *mtx,Vector<float,_4> *vec)

{
  int row;
  long lVar1;
  Vector<float,_3> *pVVar2;
  long lVar3;
  float v;
  ulong extraout_XMM0_Qa;
  ulong uVar4;
  float in_XMM1_Da;
  Vector<float,_3> VVar5;
  
  Vector<float,_3>::Vector((Vector<float,_3> *)this);
  uVar4 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    uVar4 = 0;
    pVVar2 = (Vector<float,_3> *)mtx;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      in_XMM1_Da = ((Vector<tcu::Vector<float,_3>,_4> *)pVVar2->m_data)->m_data[0].m_data[0] *
                   vec->m_data[lVar3];
      uVar4 = (ulong)(uint)((float)uVar4 + in_XMM1_Da);
      pVVar2 = pVVar2 + 1;
    }
    *(float *)(this + lVar1 * 4) = (float)uVar4;
    mtx = (Matrix<float,_3,_4> *)(((Vector<float,_3> *)mtx)->m_data + 1);
  }
  VVar5.m_data[2] = in_XMM1_Da;
  VVar5.m_data[0] = (float)(int)uVar4;
  VVar5.m_data[1] = (float)(int)(uVar4 >> 0x20);
  return (Vector<float,_3>)VVar5.m_data;
}

Assistant:

Vector<T, Rows> operator* (const Matrix<T, Rows, Cols>& mtx, const Vector<T, Cols>& vec)
{
	Vector<T, Rows> res;
	for (int row = 0; row < Rows; row++)
	{
		T v = T(0);
		for (int col = 0; col < Cols; col++)
			v += mtx(row,col) * vec.m_data[col];
		res.m_data[row] = v;
	}
	return res;
}